

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPSCQueueBenchmark.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  ostream *poVar3;
  rep rVar4;
  int *piVar5;
  size_type sVar6;
  long in_RSI;
  int in_EDI;
  time_point stop_3;
  int val;
  int i_3;
  time_point start_3;
  thread t_3;
  spsc_queue<int> q2_1;
  spsc_queue<int> q1_1;
  time_point stop_2;
  int i_2;
  time_point start_2;
  thread t_2;
  spsc_queue<int> q_1;
  time_point stop_1;
  int i_1;
  time_point start_1;
  thread t_1;
  SPSCQueue<int,_std::allocator<int>_> q2;
  SPSCQueue<int,_std::allocator<int>_> q1;
  time_point stop;
  int i;
  time_point start;
  thread t;
  SPSCQueue<int,_std::allocator<int>_> q;
  int64_t iters;
  size_t queueSize;
  int cpu2;
  int cpu1;
  duration<long,_std::ratio<1L,_1000000000L>_> local_760;
  duration<long,_std::ratio<1L,_1000000000L>_> local_758;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_750;
  int local_748;
  int local_744;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_740;
  type local_738;
  thread local_720;
  spsc_queue<int> local_718;
  spsc_queue<int> local_6c0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_668;
  duration<long,_std::ratio<1L,_1000000000L>_> local_660;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_658;
  int local_64c;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_648;
  type local_640;
  thread local_630;
  spsc_queue<int> local_628;
  duration<long,_std::ratio<1L,_1000000000L>_> local_5d0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_5c8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_5c0;
  int local_5b4;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_5b0;
  type local_5a8;
  thread local_590;
  allocator<int> local_581;
  SPSCQueue<int,_std::allocator<int>_> local_580;
  allocator<int> local_401;
  SPSCQueue<int,_std::allocator<int>_> local_400;
  duration<long,_std::ratio<1L,_1000000000L>_> local_288;
  duration<long,_std::ratio<1L,_1000000000L>_> local_280;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_278;
  int local_26c;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_268;
  type local_260;
  thread local_250;
  allocator<int> local_241;
  SPSCQueue<int,_std::allocator<int>_> local_240;
  undefined8 local_d8;
  undefined8 local_d0;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_89;
  string local_88;
  int local_68;
  int local_64;
  long local_60;
  undefined4 local_54;
  
  local_54 = 0;
  local_64 = -1;
  local_68 = -1;
  if (in_EDI == 3) {
    pcVar1 = *(char **)(in_RSI + 8);
    local_60 = in_RSI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar1,&local_89);
    local_64 = std::__cxx11::stoi(&local_88,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    pcVar1 = *(char **)(local_60 + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,pcVar1,&local_c1);
    local_68 = std::__cxx11::stoi(&local_c0,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
  }
  local_d0 = 10000000;
  local_d8 = 10000000;
  poVar3 = std::operator<<((ostream *)&std::cout,"SPSCQueue:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::allocator<int>::allocator(&local_241);
  rigtorp::SPSCQueue<int,_std::allocator<int>_>::SPSCQueue(&local_240,10000000,&local_241);
  std::allocator<int>::~allocator(&local_241);
  local_260.cpu1 = &local_64;
  local_260.q = &local_240;
  std::thread::thread<main::__0,,void>(&local_250,&local_260);
  pinThread(local_68);
  local_268.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  for (local_26c = 0; local_26c < 10000000; local_26c = local_26c + 1) {
    rigtorp::SPSCQueue<int,std::allocator<int>>::emplace<int&>
              ((SPSCQueue<int,std::allocator<int>> *)&local_240,&local_26c);
  }
  std::thread::join();
  local_278.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_288.__r = (rep)std::chrono::operator-(&local_278,&local_268);
  local_280.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                      (&local_288);
  rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_280);
  poVar3 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,
                      SUB168((ZEXT816(0) << 0x40 | ZEXT816(10000000000000)) / SEXT816(rVar4),0));
  poVar3 = std::operator<<(poVar3," ops/ms");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::thread::~thread(&local_250);
  rigtorp::SPSCQueue<int,_std::allocator<int>_>::~SPSCQueue(&local_240);
  std::allocator<int>::allocator(&local_401);
  rigtorp::SPSCQueue<int,_std::allocator<int>_>::SPSCQueue(&local_400,10000000,&local_401);
  std::allocator<int>::~allocator(&local_401);
  std::allocator<int>::allocator(&local_581);
  rigtorp::SPSCQueue<int,_std::allocator<int>_>::SPSCQueue(&local_580,10000000,&local_581);
  std::allocator<int>::~allocator(&local_581);
  local_5a8.cpu1 = &local_64;
  local_5a8.q1 = &local_400;
  local_5a8.q2 = &local_580;
  std::thread::thread<main::__1,,void>(&local_590,&local_5a8);
  pinThread(local_68);
  local_5b0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  for (local_5b4 = 0; local_5b4 < 10000000; local_5b4 = local_5b4 + 1) {
    rigtorp::SPSCQueue<int,std::allocator<int>>::emplace<int&>
              ((SPSCQueue<int,std::allocator<int>> *)&local_400,&local_5b4);
    do {
      piVar5 = rigtorp::SPSCQueue<int,_std::allocator<int>_>::front(&local_580);
    } while (piVar5 == (int *)0x0);
    rigtorp::SPSCQueue<int,_std::allocator<int>_>::pop(&local_580);
  }
  local_5c0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  std::thread::join();
  local_5d0.__r = (rep)std::chrono::operator-(&local_5c0,&local_5b0);
  local_5c8.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                      (&local_5d0);
  rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_5c8);
  poVar3 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,rVar4 / 10000000 - rVar4 / -0x6769800000000000);
  poVar3 = std::operator<<(poVar3," ns RTT");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::thread::~thread(&local_590);
  rigtorp::SPSCQueue<int,_std::allocator<int>_>::~SPSCQueue(&local_580);
  rigtorp::SPSCQueue<int,_std::allocator<int>_>::~SPSCQueue(&local_400);
  poVar3 = std::operator<<((ostream *)&std::cout,"boost::lockfree::spsc:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  boost::lockfree::spsc_queue<int>::spsc_queue(&local_628,10000000);
  local_640.cpu1 = &local_64;
  local_640.q = &local_628;
  std::thread::thread<main::__2,,void>(&local_630,&local_640);
  pinThread(local_68);
  local_648.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  for (local_64c = 0; local_64c < 10000000; local_64c = local_64c + 1) {
    do {
      bVar2 = boost::lockfree::spsc_queue<int>::push(&local_628,&local_64c);
    } while (((bVar2 ^ 0xffU) & 1) != 0);
  }
  std::thread::join();
  local_658.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_668.__r = (rep)std::chrono::operator-(&local_658,&local_648);
  local_660.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                      (&local_668);
  rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_660);
  poVar3 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,
                      SUB168((ZEXT816(0) << 0x40 | ZEXT816(10000000000000)) / SEXT816(rVar4),0));
  poVar3 = std::operator<<(poVar3," ops/ms");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::thread::~thread(&local_630);
  boost::lockfree::spsc_queue<int>::~spsc_queue(&local_628);
  boost::lockfree::spsc_queue<int>::spsc_queue(&local_6c0,10000000);
  boost::lockfree::spsc_queue<int>::spsc_queue(&local_718,10000000);
  local_738.cpu1 = &local_64;
  local_738.q1 = &local_6c0;
  local_738.q2 = &local_718;
  std::thread::thread<main::__3,,void>(&local_720,&local_738);
  pinThread(local_68);
  local_740.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  for (local_744 = 0; local_744 < 10000000; local_744 = local_744 + 1) {
    do {
      bVar2 = boost::lockfree::spsc_queue<int>::push(&local_6c0,&local_744);
    } while (((bVar2 ^ 0xffU) & 1) != 0);
    do {
      sVar6 = boost::lockfree::spsc_queue<int>::pop(&local_718,&local_748,1);
    } while (sVar6 != 1);
  }
  local_750.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  std::thread::join();
  local_760.__r = (rep)std::chrono::operator-(&local_750,&local_740);
  local_758.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                      (&local_760);
  rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_758);
  poVar3 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,rVar4 / 10000000 - rVar4 / -0x6769800000000000);
  poVar3 = std::operator<<(poVar3," ns RTT");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::thread::~thread(&local_720);
  boost::lockfree::spsc_queue<int>::~spsc_queue(&local_718);
  boost::lockfree::spsc_queue<int>::~spsc_queue(&local_6c0);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  (void)argc, (void)argv;

  using namespace rigtorp;

  int cpu1 = -1;
  int cpu2 = -1;

  if (argc == 3) {
    cpu1 = std::stoi(argv[1]);
    cpu2 = std::stoi(argv[2]);
  }

  const size_t queueSize = 10000000;
  const int64_t iters = 10000000;

  std::cout << "SPSCQueue:" << std::endl;

  {
    SPSCQueue<int> q(queueSize);
    auto t = std::thread([&] {
      pinThread(cpu1);
      for (int i = 0; i < iters; ++i) {
        while (!q.front())
          ;
        if (*q.front() != i) {
          throw std::runtime_error("");
        }
        q.pop();
      }
    });

    pinThread(cpu2);

    auto start = std::chrono::steady_clock::now();
    for (int i = 0; i < iters; ++i) {
      q.emplace(i);
    }
    t.join();
    auto stop = std::chrono::steady_clock::now();
    std::cout << iters * 1000000 /
                     std::chrono::duration_cast<std::chrono::nanoseconds>(stop -
                                                                          start)
                         .count()
              << " ops/ms" << std::endl;
  }

  {
    SPSCQueue<int> q1(queueSize), q2(queueSize);
    auto t = std::thread([&] {
      pinThread(cpu1);
      for (int i = 0; i < iters; ++i) {
        while (!q1.front())
          ;
        q2.emplace(*q1.front());
        q1.pop();
      }
    });

    pinThread(cpu2);

    auto start = std::chrono::steady_clock::now();
    for (int i = 0; i < iters; ++i) {
      q1.emplace(i);
      while (!q2.front())
        ;
      q2.pop();
    }
    auto stop = std::chrono::steady_clock::now();
    t.join();
    std::cout << std::chrono::duration_cast<std::chrono::nanoseconds>(stop -
                                                                      start)
                         .count() /
                     iters
              << " ns RTT" << std::endl;
  }

#if __has_include(<boost/lockfree/spsc_queue.hpp> )
  std::cout << "boost::lockfree::spsc:" << std::endl;
  {
    boost::lockfree::spsc_queue<int> q(queueSize);
    auto t = std::thread([&] {
      pinThread(cpu1);
      for (int i = 0; i < iters; ++i) {
        int val;
        while (q.pop(&val, 1) != 1)
          ;
        if (val != i) {
          throw std::runtime_error("");
        }
      }
    });

    pinThread(cpu2);

    auto start = std::chrono::steady_clock::now();
    for (int i = 0; i < iters; ++i) {
      while (!q.push(i))
        ;
    }
    t.join();
    auto stop = std::chrono::steady_clock::now();
    std::cout << iters * 1000000 /
                     std::chrono::duration_cast<std::chrono::nanoseconds>(stop -
                                                                          start)
                         .count()
              << " ops/ms" << std::endl;
  }

  {
    boost::lockfree::spsc_queue<int> q1(queueSize), q2(queueSize);
    auto t = std::thread([&] {
      pinThread(cpu1);
      for (int i = 0; i < iters; ++i) {
        int val;
        while (q1.pop(&val, 1) != 1)
          ;
        while (!q2.push(val))
          ;
      }
    });

    pinThread(cpu2);

    auto start = std::chrono::steady_clock::now();
    for (int i = 0; i < iters; ++i) {
      while (!q1.push(i))
        ;
      int val;
      while (q2.pop(&val, 1) != 1)
        ;
    }
    auto stop = std::chrono::steady_clock::now();
    t.join();
    std::cout << std::chrono::duration_cast<std::chrono::nanoseconds>(stop -
                                                                      start)
                         .count() /
                     iters
              << " ns RTT" << std::endl;
  }
#endif

#if __has_include(<folly/ProducerConsumerQueue.h>)
  std::cout << "folly::ProducerConsumerQueue:" << std::endl;

  {
    folly::ProducerConsumerQueue<int> q(queueSize);
    auto t = std::thread([&] {
      pinThread(cpu1);
      for (int i = 0; i < iters; ++i) {
        int val;
        while (!q.read(val))
          ;
        if (val != i) {
          throw std::runtime_error("");
        }
      }
    });

    pinThread(cpu2);

    auto start = std::chrono::steady_clock::now();
    for (int i = 0; i < iters; ++i) {
      while (!q.write(i))
        ;
    }
    t.join();
    auto stop = std::chrono::steady_clock::now();
    std::cout << iters * 1000000 /
                     std::chrono::duration_cast<std::chrono::nanoseconds>(stop -
                                                                          start)
                         .count()
              << " ops/ms" << std::endl;
  }

  {
    folly::ProducerConsumerQueue<int> q1(queueSize), q2(queueSize);
    auto t = std::thread([&] {
      pinThread(cpu1);
      for (int i = 0; i < iters; ++i) {
        int val;
        while (!q1.read(val))
          ;
        q2.write(val);
      }
    });

    pinThread(cpu2);

    auto start = std::chrono::steady_clock::now();
    for (int i = 0; i < iters; ++i) {
      while (!q1.write(i))
        ;
      int val;
      while (!q2.read(val))
        ;
    }
    auto stop = std::chrono::steady_clock::now();
    t.join();
    std::cout << std::chrono::duration_cast<std::chrono::nanoseconds>(stop -
                                                                      start)
                         .count() /
                     iters
              << " ns RTT" << std::endl;
  }
#endif

  return 0;
}